

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.h
# Opt level: O2

void __thiscall dlib::drawable::set_pos(drawable *this,long x,long y)

{
  rectangle *this_00;
  drawable_window *this_01;
  unsigned_long uVar1;
  unsigned_long uVar2;
  rectangle old;
  rectangle local_50;
  
  rmutex::lock(this->m,1);
  this_00 = &this->rect;
  old.l = (this->rect).l;
  old.t = (this->rect).t;
  old.r = (this->rect).r;
  old.b = (this->rect).b;
  uVar1 = rectangle::width(this_00);
  uVar2 = rectangle::height(this_00);
  (this->rect).t = y;
  (this->rect).l = x;
  (this->rect).r = x + uVar1 + -1;
  (this->rect).b = y + -1 + uVar2;
  this_01 = this->parent;
  rectangle::operator+(&local_50,this_00,&old);
  base_window::invalidate_rectangle(&this_01->super_base_window,&local_50);
  rmutex::unlock(this->m,1);
  return;
}

Assistant:

virtual void set_pos (
            long x,
            long y
        )
        {
            m.lock();       
            rectangle old(rect);            

            const unsigned long width = rect.width();
            const unsigned long height = rect.height();
            rect.set_top(y);
            rect.set_left(x);
            rect.set_right(static_cast<long>(x+width)-1);
            rect.set_bottom(static_cast<long>(y+height)-1);
            
            parent.invalidate_rectangle(rect+old);
            m.unlock();
        }